

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnLayerDropout.cpp
# Opt level: O3

void __thiscall tfs::DnnLayerDropout::setup(DnnLayerDropout *this,bool trainable)

{
  Matrix *pMVar1;
  ulong __n;
  TMatrix<double> *this_00;
  TMatrix<double> *pTVar2;
  bool *__s;
  unsigned_long line;
  char *format;
  
  pTVar2 = (this->super_DnnLayer).m_in_a;
  if (((pTVar2 == (TMatrix<double> *)0x0) || (pTVar2->m_data == (double *)0x0)) ||
     (pTVar2->m_end < pTVar2->m_data)) {
    format = "Input activation matrix is bad";
    line = 0x27;
  }
  else {
    if ((!trainable) || (pMVar1 = (this->super_DnnLayer).m_in_dw, pMVar1 == (Matrix *)0x0)) {
LAB_001133e3:
      this_00 = (TMatrix<double> *)operator_new(0x50);
      TMatrix<double>::TMatrix(this_00,pTVar2,false);
      (this->super_DnnLayer).m_out_a = this_00;
      if (trainable) {
        pTVar2 = (TMatrix<double> *)operator_new(0x50);
        TMatrix<double>::TMatrix(pTVar2,this_00,false);
        (this->super_DnnLayer).m_out_dw = pTVar2;
        this_00 = (this->super_DnnLayer).m_out_a;
      }
      __n = this_00->m_count;
      __s = (bool *)operator_new__(__n);
      this->m_dropped = __s;
      if (__n != 0) {
        memset(__s,0,__n);
        return;
      }
      return;
    }
    if ((pMVar1->m_data == (double *)0x0) || (pMVar1->m_end < pMVar1->m_data)) {
      format = "Input dw matrix is bad";
      line = 0x2c;
    }
    else {
      if (pTVar2->m_count == pMVar1->m_count) goto LAB_001133e3;
      format = "in_a != in_dw size";
      line = 0x30;
    }
  }
  report_problem("Error",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnLayerDropout.cpp"
                 ,"setup",line,format);
  return;
}

Assistant:

void
    DnnLayerDropout::setup( const bool trainable ) {
        // -----------------------------------------------------------------------------------
        // S = size of input data
        // out_a[S]  = activations of each neuron
        // out_dw[S] = gradient
        // -----------------------------------------------------------------------------------
        if( matrixBad( m_in_a )) {
            log_error( "Input activation matrix is bad" );
            return;
        }
        if( trainable && m_in_dw != 0 ) {       // Input layers can have null m_out_dw
            if( matrixBad( m_in_dw )) {
                log_error( "Input dw matrix is bad" );
                return;
            }
            if( m_in_a->count() != m_in_dw->count()) {  // By default, we expect the dimensions to be the same.
                log_error( "in_a != in_dw size" );
                return;
            }
        }
        m_out_a = new Matrix( *m_in_a );         // Output dimension matches input dimension
        if( trainable ) {
            m_out_dw = new Matrix( *m_out_a );   // Output dimension matches input dimension
        }
        const unsigned long count = m_out_a->count();
        m_dropped = new bool[ count ];
        for( unsigned long ii = 0; ii < count; ii++ ) {
            m_dropped[ii] = false;
        }
        return;
    }